

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

void TCLAP::ExtractValue<char>(char *destVal,string *strVal,ValueLike *vl)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  ArgParseException *pAVar4;
  allocator local_2a1;
  string local_2a0 [32];
  char local_280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [38];
  undefined1 local_23a;
  allocator local_239;
  string local_238 [32];
  char local_218 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8 [32];
  int local_1d8;
  int valuesRead;
  allocator local_1c1;
  string local_1c0 [32];
  istringstream local_1a0 [8];
  istringstream is;
  ValueLike *vl_local;
  string *strVal_local;
  char *destVal_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,pcVar3,&local_1c1);
  std::__cxx11::istringstream::istringstream(local_1a0,local_1c0,8);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  local_1d8 = 0;
  while ((bVar1 = std::ios::good(), (bVar1 & 1) != 0 && (iVar2 = std::istream::peek(), iVar2 != -1))
        ) {
    std::operator>>((istream *)local_1a0,destVal);
    local_1d8 = local_1d8 + 1;
  }
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    if (local_1d8 < 2) {
      std::__cxx11::istringstream::~istringstream(local_1a0);
      return;
    }
    pAVar4 = (ArgParseException *)__cxa_allocate_exception(0x68);
    std::operator+(local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "More than one valid value parsed from string \'");
    std::operator+(local_260,local_280);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a0,"undefined",&local_2a1);
    ArgParseException::ArgParseException(pAVar4,local_260,(string *)local_2a0);
    __cxa_throw(pAVar4,&ArgParseException::typeinfo,ArgParseException::~ArgParseException);
  }
  local_23a = 1;
  pAVar4 = (ArgParseException *)__cxa_allocate_exception(0x68);
  std::operator+(local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Couldn\'t read argument value from string \'");
  std::operator+(local_1f8,local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"undefined",&local_239);
  ArgParseException::ArgParseException(pAVar4,local_1f8,(string *)local_238);
  local_23a = 0;
  __cxa_throw(pAVar4,&ArgParseException::typeinfo,ArgParseException::~ArgParseException);
}

Assistant:

void
ExtractValue(T &destVal, const std::string& strVal, ValueLike vl)
{
    static_cast<void>(vl); // Avoid warning about unused vl
    istringstream is(strVal.c_str());

    int valuesRead = 0;
    while ( is.good() ) {
	if ( is.peek() != EOF )
#ifdef TCLAP_SETBASE_ZERO
	    is >> std::setbase(0) >> destVal;
#else
	    is >> destVal;
#endif
	else
	    break;

	valuesRead++;
    }

    if ( is.fail() )
	throw( ArgParseException("Couldn't read argument value "
				 "from string '" + strVal + "'"));


    if ( valuesRead > 1 )
	throw( ArgParseException("More than one valid value parsed from "
				 "string '" + strVal + "'"));

}